

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.h
# Opt level: O0

void __thiscall
rpn::RPNExpression::Push<rpn::StringExpression,std::__cxx11::string>
          (RPNExpression *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  undefined1 local_28 [8];
  unique_ptr<rpn::IExpression,_std::default_delete<rpn::IExpression>_> local_20;
  undefined1 local_18 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  RPNExpression *this_local;
  
  local_18 = (undefined1  [8])args;
  args_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  std::make_unique<rpn::StringExpression,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28);
  std::unique_ptr<rpn::IExpression,std::default_delete<rpn::IExpression>>::
  unique_ptr<rpn::StringExpression,std::default_delete<rpn::StringExpression>,void>
            ((unique_ptr<rpn::IExpression,std::default_delete<rpn::IExpression>> *)&local_20,
             (unique_ptr<rpn::StringExpression,_std::default_delete<rpn::StringExpression>_> *)
             local_28);
  Push(this,(expression_ptr *)&local_20);
  std::unique_ptr<rpn::IExpression,_std::default_delete<rpn::IExpression>_>::~unique_ptr(&local_20);
  std::unique_ptr<rpn::StringExpression,_std::default_delete<rpn::StringExpression>_>::~unique_ptr
            ((unique_ptr<rpn::StringExpression,_std::default_delete<rpn::StringExpression>_> *)
             local_28);
  return;
}

Assistant:

void Push(ExprArgs&&... args)
    {
        Push(std::make_unique<ExprT>(std::forward<ExprArgs>(args)...));
    }